

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O1

void __thiscall
WaitableSafeQueue<WriterData>::WaitableSafeQueue
          (WaitableSafeQueue<WriterData> *this,uint32_t maxSize)

{
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>._vptr_SafeQueue =
       (_func_int **)&PTR__SafeQueue_00240008;
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_mtx.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_mtx.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_mtx.
           super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_mtx.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_mtx.
  super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c.
  super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  *(size_t *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c
           .super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
           super__Deque_impl_data + 8) = 0;
  ((iterator *)
  ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c.
          super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.super__Deque_impl_data
  + 0x10))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c
           .super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
           super__Deque_impl_data + 0x18) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c
           .super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
           super__Deque_impl_data + 0x20) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c
           .super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
           super__Deque_impl_data + 0x28) = (_Map_pointer)0x0;
  ((iterator *)
  ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c.
          super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.super__Deque_impl_data
  + 0x30))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c
           .super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
           super__Deque_impl_data + 0x38) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c
           .super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
           super__Deque_impl_data + 0x40) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_queue.c
           .super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
           super__Deque_impl_data + 0x48) = (_Map_pointer)0x0;
  std::_Deque_base<WriterData,_std::allocator<WriterData>_>::_M_initialize_map
            ((_Deque_base<WriterData,_std::allocator<WriterData>_> *)
             &(this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.
              m_queue,0);
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>.m_maxSize =
       (ulong)maxSize;
  (this->super_SafeQueueWithNotification<WriterData>).m_mtx = &this->m_mtx;
  (this->super_SafeQueueWithNotification<WriterData>).m_cond = &this->m_cond;
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>._vptr_SafeQueue =
       (_func_int **)&PTR__WaitableSafeQueue_0023ff68;
  (this->m_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->m_cond);
  return;
}

Assistant:

WaitableSafeQueue(const uint32_t maxSize) : SafeQueueWithNotification<T>(maxSize, m_mtx, m_cond) {}